

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

Operand * translateLiteral(Operand *__return_storage_ptr__,Operand *reg)

{
  char cVar1;
  char *pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  pointer pcVar3;
  uint __val;
  _AutomatonPtr **pp_Var4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  pointer psVar9;
  int *piVar10;
  long *plVar11;
  undefined8 uVar12;
  uint uVar13;
  _AutomatonPtr *p_Var14;
  size_type *psVar15;
  undefined1 *puVar16;
  uint uVar17;
  smatch match;
  string __str;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_e0;
  int local_bc;
  undefined1 local_b8 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a0;
  _AutomatonPtr *local_90 [2];
  _AutomatonPtr local_80;
  string local_70;
  string local_50;
  
  pcVar2 = (reg->value)._M_dataplus._M_p;
  cVar1 = *pcVar2;
  if ((cVar1 == '$') && ((int)pcVar2[1] - 0x30U < 10)) {
    iVar7 = parse_8bit_literal(&reg->value);
    literal(__return_storage_ptr__,iVar7);
  }
  else {
    if ((cVar1 == '.') || ((cVar1 == '$' && (pcVar2[1] == '.')))) {
      psVar9 = (pointer)(local_b8 + 0x10);
      local_b8._8_8_ = (pointer)0x0;
      local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = psVar9;
      if (*pcVar2 == '$') {
        local_e0._0_8_ = &local_e0._M_automaton;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_e0,pcVar2 + 1,pcVar2 + (reg->value)._M_string_length);
      }
      else {
        local_e0._0_8_ = &local_e0._M_automaton;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_e0,pcVar2,pcVar2 + (reg->value)._M_string_length);
      }
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_e0);
      if ((_AutomatonPtr *)local_e0._0_8_ != &local_e0._M_automaton) {
        operator_delete((void *)local_e0._0_8_,
                        (ulong)((long)&((local_e0._M_automaton.
                                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super__NFA_base)._M_paren_stack.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      while (uVar8 = std::__cxx11::string::find(local_b8,0x11e519,0), uVar8 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)local_b8,uVar8,(char *)0x1,0x11e19a);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_b8._0_8_,
                 (undefined1 *)
                 ((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_b8._0_8_)->first)._M_current +
                 (long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_b8._8_8_)->first)._M_current));
      literal(__return_storage_ptr__,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_b8._0_8_ == psVar9) {
        return __return_storage_ptr__;
      }
      puVar16 = (undefined1 *)
                ((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_b8._16_8_)->first)._M_current + 1);
    }
    else {
      local_b8._16_8_ = (pointer)0x0;
      _Stack_a0._M_current = (char *)0x0;
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = (pointer)0x0;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_e0,"(\\d+)\\(%esp\\)",0x10);
      __s._M_current = (reg->value)._M_dataplus._M_p;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(__s._M_current + (reg->value)._M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_b8,&local_e0,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_e0);
      if (bVar6) {
        if (local_b8._0_8_ == local_b8._8_8_) {
          bVar6 = false;
        }
        else {
          bVar6 = ((long)(local_b8._8_8_ - local_b8._0_8_) >> 3) * -0x5555555555555555 - 5U <
                  0xfffffffffffffffe;
        }
        psVar9 = (pointer)(local_b8._8_8_ + -0x48);
        if (bVar6) {
          psVar9 = (pointer)(local_b8._0_8_ + 0x18);
        }
        pp_Var4 = (_AutomatonPtr **)&local_e0._M_automaton;
        local_e0._0_8_ = pp_Var4;
        if (psVar9->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_e0,
                     (psVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_e0._8_8_ = 0;
          local_e0._M_automaton.
          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)
                    ((ulong)local_e0._M_automaton.
                            super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr & 0xffffffffffffff00);
        }
        uVar12 = local_e0._0_8_;
        piVar10 = __errno_location();
        local_bc = *piVar10;
        *piVar10 = 0;
        uVar8 = strtol((char *)uVar12,(char **)local_90,10);
        if (local_90[0] == (_AutomatonPtr *)uVar12) {
          std::__throw_invalid_argument("stoi");
LAB_00116e15:
          uVar12 = std::__throw_out_of_range("stoi");
          if ((pointer)local_b8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
          }
          _Unwind_Resume(uVar12);
        }
        iVar7 = (int)uVar8;
        if (((long)iVar7 != uVar8) || (*piVar10 == 0x22)) goto LAB_00116e15;
        if (*piVar10 == 0) {
          *piVar10 = local_bc;
        }
        uVar17 = (int)(((uint)(uVar8 >> 0x1f) & 1) + iVar7) >> 1;
        if ((_AutomatonPtr **)local_e0._0_8_ != pp_Var4) {
          operator_delete((void *)local_e0._0_8_,
                          (ulong)((long)&((local_e0._M_automaton.
                                           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super__NFA_base)._M_paren_stack.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        __val = -uVar17;
        if (0 < (int)uVar17) {
          __val = uVar17;
        }
        uVar17 = 1;
        if (9 < __val) {
          uVar8 = (ulong)__val;
          uVar5 = 4;
          do {
            uVar17 = uVar5;
            uVar13 = (uint)uVar8;
            if (uVar13 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_00116c8f;
            }
            if (uVar13 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_00116c8f;
            }
            if (uVar13 < 10000) goto LAB_00116c8f;
            uVar8 = uVar8 / 10000;
            uVar5 = uVar17 + 4;
          } while (99999 < uVar13);
          uVar17 = uVar17 + 1;
        }
LAB_00116c8f:
        local_90[0] = &local_80;
        std::__cxx11::string::_M_construct((ulong)local_90,(iVar7 < -1) + (char)uVar17);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)&(local_90[0]->
                                   super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + (ulong)(iVar7 < -1)),uVar17,__val);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x11f41b);
        p_Var14 = (_AutomatonPtr *)(plVar11 + 2);
        if ((_AutomatonPtr *)*plVar11 == p_Var14) {
          local_e0._M_automaton.
          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (p_Var14->
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
          local_e0._M_automaton.
          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[3];
          local_e0._0_8_ = pp_Var4;
        }
        else {
          local_e0._M_automaton.
          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (p_Var14->
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
          local_e0._0_8_ = (_AutomatonPtr *)*plVar11;
        }
        local_e0._8_8_ = plVar11[1];
        *plVar11 = (long)p_Var14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_e0);
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_70.field_2._M_allocated_capacity = *psVar15;
          local_70.field_2._8_8_ = plVar11[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar15;
          local_70._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_70._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        literal(__return_storage_ptr__,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((_AutomatonPtr **)local_e0._0_8_ != pp_Var4) {
          operator_delete((void *)local_e0._0_8_,
                          (ulong)((long)&((local_e0._M_automaton.
                                           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super__NFA_base)._M_paren_stack.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if (local_90[0] != &local_80) {
          operator_delete(local_90[0],
                          (ulong)((long)&((local_80.
                                           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super__NFA_base)._M_paren_stack.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data + 1));
        }
      }
      else {
        iVar7 = reg->reg_num;
        __return_storage_ptr__->type = reg->type;
        __return_storage_ptr__->reg_num = iVar7;
        (__return_storage_ptr__->value)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->value).field_2;
        pcVar3 = (reg->value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->value,pcVar3,
                   pcVar3 + (reg->value)._M_string_length);
      }
      if ((pointer)local_b8._0_8_ == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      puVar16 = (undefined1 *)(local_b8._16_8_ - local_b8._0_8_);
    }
    operator_delete((void *)local_b8._0_8_,(ulong)puVar16);
  }
  return __return_storage_ptr__;
}

Assistant:

static Operand translateLiteral(const Operand reg) {
	// Number
	if (reg.value[0] == '$') {
		if (isdigit(reg.value[1])) {
			return literal(parse_8bit_literal(reg.value));
		}
	}
	if (reg.value[0] == '.' || (reg.value[0] =='$' && reg.value[1] == '.')) {
		std::string new_string;
		if (reg.value[0] == '$')
			new_string = std::string(std::next(reg.value.begin()), reg.value.end());
		else
			new_string = std::string(reg.value.begin(), reg.value.end());
		std::size_t pos;
		while ((pos = new_string.find(".")) != std::string::npos) {
			new_string.replace(pos, 1, "period_");
		}
		return literal(new_string);
	}
	std::smatch match;
	if (std::regex_match(reg.value, match, std::regex(R"((\d+)\(%esp\))"))) {
		// This is a stack index (e.g. "16(%esp)"). Convert this to a z80 index.
		int index = std::stoi(match[1]) / 2;
		return literal("(ix + " + std::to_string(index) + ")");
	}
	return reg;
}